

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_lsd.cpp
# Opt level: O0

void msd_lsd<12u>(Cacheblock<12U> *cache,size_t N,size_t depth)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  byte *pbVar4;
  undefined8 *puVar5;
  pointer __s1;
  pointer __s2;
  reference pvVar6;
  Cacheblock<12U> *pCVar7;
  ulong local_1060;
  size_t i_3;
  size_t cnt;
  size_t start;
  size_t i_2;
  size_t i_1;
  size_t bucketindex [256];
  Cacheblock<12U> *sorted;
  size_t i;
  size_t bucketsize [256];
  int byte;
  size_t depth_local;
  size_t N_local;
  Cacheblock<12U> *cache_local;
  
  if (N < 0x20) {
    insertion_sort<12u>(cache,(int)N,depth);
  }
  else {
    fill_cache<12u>(cache,N,depth);
    for (bucketsize[0xff]._4_4_ = 0xb; -1 < bucketsize[0xff]._4_4_;
        bucketsize[0xff]._4_4_ = bucketsize[0xff]._4_4_ + -1) {
      memset(&i,0,0x800);
      for (sorted = (Cacheblock<12U> *)0x0; sorted < N;
          sorted = (Cacheblock<12U> *)((sorted->chars)._M_elems + 1)) {
        pbVar4 = std::array<unsigned_char,_12UL>::operator[]
                           (&cache[(long)sorted].chars,(long)bucketsize[0xff]._4_4_);
        bucketsize[(ulong)*pbVar4 - 1] = bucketsize[(ulong)*pbVar4 - 1] + 1;
      }
      bucketindex[0xff] = (size_t)malloc(N * 0x18);
      for (i_2 = 1; i_2 < 0x100; i_2 = i_2 + 1) {
        bucketindex[i_2 - 1] = bucketindex[i_2 - 2] + bucketsize[i_2 - 2];
      }
      for (start = 0; sVar2 = bucketindex[0xff], start < N; start = start + 1) {
        pbVar4 = std::array<unsigned_char,_12UL>::operator[]
                           (&cache[start].chars,(long)bucketsize[0xff]._4_4_);
        sVar1 = bucketindex[(ulong)*pbVar4 - 1];
        bucketindex[(ulong)*pbVar4 - 1] = sVar1 + 1;
        puVar5 = (undefined8 *)(sVar2 + sVar1 * 0x18);
        pCVar7 = cache + start;
        *puVar5 = *(undefined8 *)(pCVar7->chars)._M_elems;
        puVar5[1] = *(undefined8 *)((pCVar7->chars)._M_elems + 8);
        puVar5[2] = pCVar7->ptr;
      }
      memcpy(cache,(void *)bucketindex[0xff],N * 0x18);
      free((void *)bucketindex[0xff]);
    }
    cnt = 0;
    i_3 = 1;
    for (local_1060 = 0; local_1060 < N - 1; local_1060 = local_1060 + 1) {
      __s1 = std::array<unsigned_char,_12UL>::data(&cache[local_1060].chars);
      __s2 = std::array<unsigned_char,_12UL>::data(&cache[local_1060 + 1].chars);
      iVar3 = memcmp(__s1,__s2,0xc);
      if (iVar3 == 0) {
        i_3 = i_3 + 1;
      }
      else {
        if (1 < i_3) {
          pvVar6 = std::array<unsigned_char,_12UL>::operator[](&cache[cnt].chars,0xb);
          if (*pvVar6 != '\0') {
            msd_lsd<12u>(cache + cnt,i_3,depth + 0xc);
          }
        }
        i_3 = 1;
        cnt = local_1060 + 1;
      }
    }
    if (1 < i_3) {
      pvVar6 = std::array<unsigned_char,_12UL>::operator[](&cache[cnt].chars,0xb);
      if (*pvVar6 != '\0') {
        msd_lsd<12u>(cache + cnt,i_3,depth + 0xc);
      }
    }
  }
  return;
}

Assistant:

static void
msd_lsd(Cacheblock<CachedChars>* cache, size_t N, size_t depth)
{
	static_assert(CachedChars>=1, "CachedChars must be positive");
	if (N < 32) {
		insertion_sort(cache, N, depth);
		return;
	}
	fill_cache(cache, N, depth);
	for (int byte=CachedChars-1; byte >= 0; --byte) {
		size_t bucketsize[256] = {0};
		for (size_t i=0; i < N; ++i)
			++bucketsize[cache[i].chars[byte]];
		Cacheblock<CachedChars>* sorted = (Cacheblock<CachedChars>*)
			malloc(N*sizeof(Cacheblock<CachedChars>));
		size_t bucketindex[256];
		bucketindex[0] = 0;
		for (size_t i=1; i < 256; ++i)
			bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
		for (size_t i=0; i < N; ++i)
			memcpy(&sorted[bucketindex[cache[i].chars[byte]]++],
					cache+i,
					sizeof(Cacheblock<CachedChars>));
		memcpy(cache, sorted, N*sizeof(Cacheblock<CachedChars>));
		free(sorted);
	}
	size_t start=0, cnt=1;
	for (size_t i=0; i < N-1; ++i) {
		if (memcmp(cache[i].chars.data(), cache[i+1].chars.data(),
				CachedChars) == 0) {
			++cnt;
			continue;
		}
		if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
			msd_lsd(cache+start, cnt, depth+CachedChars);
		}
		cnt = 1;
		start = i+1;
	}
	if (cnt > 1 && cache[start].chars[CachedChars-1] != 0) {
		msd_lsd(cache+start, cnt, depth+CachedChars);
	}
}